

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_enc.cc
# Opt level: O0

int ASN1_item_i2d(ASN1_VALUE *val,uchar **out,ASN1_ITEM *it)

{
  int iVar1;
  int iVar2;
  uchar *orig_ptr;
  int len2;
  int len;
  uchar *buf;
  uchar *p;
  ASN1_ITEM *it_local;
  uchar **out_local;
  ASN1_VALUE *val_local;
  
  p = (uchar *)it;
  it_local = (ASN1_ITEM *)out;
  out_local = (uchar **)val;
  if ((out == (uchar **)0x0) || (*out != (uchar *)0x0)) {
    val_local._4_4_ = ASN1_item_ex_i2d((ASN1_VALUE **)&out_local,out,it,-1,0);
  }
  else {
    iVar1 = ASN1_item_ex_i2d((ASN1_VALUE **)&out_local,(uchar **)0x0,it,-1,0);
    val_local._4_4_ = iVar1;
    if (0 < iVar1) {
      orig_ptr = (uchar *)OPENSSL_malloc((long)iVar1);
      if (orig_ptr == (uchar *)0x0) {
        val_local._4_4_ = -1;
      }
      else {
        buf = orig_ptr;
        iVar2 = ASN1_item_ex_i2d((ASN1_VALUE **)&out_local,&buf,(ASN1_ITEM *)p,-1,0);
        if (iVar2 < 1) {
          OPENSSL_free(orig_ptr);
          val_local._4_4_ = iVar2;
        }
        else {
          if (iVar1 != iVar2) {
            __assert_fail("len == len2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                          ,0x3d,
                          "int ASN1_item_i2d(ASN1_VALUE *, unsigned char **, const ASN1_ITEM *)");
          }
          *(uchar **)it_local = orig_ptr;
        }
      }
    }
  }
  return val_local._4_4_;
}

Assistant:

int ASN1_item_i2d(ASN1_VALUE *val, unsigned char **out, const ASN1_ITEM *it) {
  if (out && !*out) {
    unsigned char *p, *buf;
    int len = ASN1_item_ex_i2d(&val, NULL, it, /*tag=*/-1, /*aclass=*/0);
    if (len <= 0) {
      return len;
    }
    buf = reinterpret_cast<uint8_t *>(OPENSSL_malloc(len));
    if (!buf) {
      return -1;
    }
    p = buf;
    int len2 = ASN1_item_ex_i2d(&val, &p, it, /*tag=*/-1, /*aclass=*/0);
    if (len2 <= 0) {
      OPENSSL_free(buf);
      return len2;
    }
    assert(len == len2);
    *out = buf;
    return len;
  }

  return ASN1_item_ex_i2d(&val, out, it, /*tag=*/-1, /*aclass=*/0);
}